

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osmesa_context.c
# Opt level: O0

void destroyContextOSMesa(_GLFWwindow *window)

{
  _GLFWwindow *window_local;
  
  if ((window->context).osmesa.handle != (OSMesaContext)0x0) {
    (*_glfw.osmesa.DestroyContext)((window->context).osmesa.handle);
    (window->context).osmesa.handle = (OSMesaContext)0x0;
  }
  if ((window->context).osmesa.buffer != (void *)0x0) {
    free((window->context).osmesa.buffer);
    (window->context).osmesa.width = 0;
    (window->context).osmesa.height = 0;
  }
  return;
}

Assistant:

static void destroyContextOSMesa(_GLFWwindow* window)
{
    if (window->context.osmesa.handle)
    {
        OSMesaDestroyContext(window->context.osmesa.handle);
        window->context.osmesa.handle = NULL;
    }

    if (window->context.osmesa.buffer)
    {
        free(window->context.osmesa.buffer);
        window->context.osmesa.width = 0;
        window->context.osmesa.height = 0;
    }
}